

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void __thiscall
discordpp::field<discordpp::RoleTags>::field
          (field<discordpp::RoleTags> *this,field<discordpp::RoleTags> *f)

{
  bool bVar1;
  field<discordpp::RoleTags> *f_local;
  field<discordpp::RoleTags> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    std::unique_ptr<discordpp::RoleTags,_std::default_delete<discordpp::RoleTags>_>::operator*
              (&f->t_);
    std::make_unique<discordpp::RoleTags,discordpp::RoleTags&>((RoleTags *)this);
  }
  else {
    std::unique_ptr<discordpp::RoleTags,std::default_delete<discordpp::RoleTags>>::
    unique_ptr<std::default_delete<discordpp::RoleTags>,void>
              ((unique_ptr<discordpp::RoleTags,std::default_delete<discordpp::RoleTags>> *)this,
               (nullptr_t)0x0);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}